

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

optional<long_long> __thiscall
QXmlStreamReaderPrivate::fastScanName(QXmlStreamReaderPrivate *this,Value *val)

{
  QStringView s;
  uint uVar1;
  qsizetype qVar2;
  long from;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar3;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  optional<long_long> oVar4;
  qsizetype pos;
  uint c;
  qsizetype n;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QString *in_stack_ffffffffffffff88;
  QStringView *in_stack_ffffffffffffff90;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  storage_type_conflict *in_stack_ffffffffffffffc8;
  QChar local_22;
  long local_20;
  _Storage<long_long,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  while (uVar1 = getChar(in_stack_ffffffffffffffa0), uVar1 != 0xffffffff) {
    if (0xfff < local_20) {
      raiseNamePrefixTooLongError(in_stack_ffffffffffffffa0);
      std::optional<long_long>::optional((optional<long_long> *)&local_18);
      uVar3 = extraout_RDX;
      goto LAB_00656b4c;
    }
    in_stack_ffffffffffffff90 = (QStringView *)(ulong)(uVar1 - 9);
    switch(in_stack_ffffffffffffff90) {
    case (QStringView *)0x0:
    case (QStringView *)0x1:
    case (QStringView *)0x4:
    case (QStringView *)0x17:
    case (QStringView *)0x18:
    case (QStringView *)0x19:
    case (QStringView *)0x1a:
    case (QStringView *)0x1c:
    case (QStringView *)0x1d:
    case (QStringView *)0x1e:
    case (QStringView *)0x1f:
    case (QStringView *)0x20:
    case (QStringView *)0x21:
    case (QStringView *)0x22:
    case (QStringView *)0x23:
    case (QStringView *)0x26:
    case (QStringView *)0x32:
    case (QStringView *)0x33:
    case (QStringView *)0x34:
    case (QStringView *)0x35:
    case (QStringView *)0x36:
    case (QStringView *)0x52:
    case (QStringView *)0x54:
    case (QStringView *)0x55:
    case (QStringView *)0x73:
      putChar((QXmlStreamReaderPrivate *)
              CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
              in_stack_ffffffffffffff7c);
      if ((in_RSI != 0) && ((long)*(short *)(in_RSI + 0x10) == local_20 + 1)) {
        *(undefined2 *)(in_RSI + 0x10) = 0;
        putChar((QXmlStreamReaderPrivate *)
                CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c);
        local_20 = local_20 + -1;
      }
      std::optional<long_long>::optional<long_long,_true>
                ((optional<long_long> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (longlong *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      uVar3 = extraout_RDX_00;
      goto LAB_00656b4c;
    case (QStringView *)0x31:
      if (in_RSI == 0) {
        putChar((QXmlStreamReaderPrivate *)
                CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c);
        std::optional<long_long>::optional<long_long,_true>
                  ((optional<long_long> *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   (longlong *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        uVar3 = extraout_RDX_02;
        goto LAB_00656b4c;
      }
      if (*(short *)(in_RSI + 0x10) != 0) {
        putChar((QXmlStreamReaderPrivate *)
                CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff7c);
        std::optional<long_long>::optional<long_long,_true>
                  ((optional<long_long> *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   (longlong *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        uVar3 = extraout_RDX_01;
        goto LAB_00656b4c;
      }
      *(short *)(in_RSI + 0x10) = (short)local_20 + 2;
    default:
      QChar::QChar<unsigned_short,_true>(&local_22,(unsigned_short)uVar1);
      QString::operator+=((QString *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          (QChar)(char16_t)((ulong)in_stack_ffffffffffffff88 >> 0x30));
      local_20 = local_20 + 1;
    }
  }
  if (in_RSI != 0) {
    *(undefined2 *)(in_RSI + 0x10) = 0;
  }
  qVar2 = QString::size((QString *)(in_RDI + 0x3c8));
  from = qVar2 - local_20;
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  s.m_size._4_4_ = in_stack_ffffffffffffffc4;
  s.m_size._0_4_ = in_stack_ffffffffffffffc0;
  s.m_data = in_stack_ffffffffffffffc8;
  putString((QXmlStreamReaderPrivate *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),s,from);
  QString::resize((QString *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::optional<long_long>::optional<int,_true>
            ((optional<long_long> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  uVar3 = extraout_RDX_03;
LAB_00656b4c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
    oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._M_engaged = (bool)local_10;
    oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
    super__Optional_payload_base<long_long>._M_payload._M_value = local_18._M_value;
    return (optional<long_long>)
           oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>;
  }
  __stack_chk_fail();
}

Assistant:

inline std::optional<qsizetype> QXmlStreamReaderPrivate::fastScanName(Value *val)
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (n >= 4096) {
            // This is too long to be a sensible name, and
            // can exhaust memory, or the range of decltype(*prefix)
            raiseNamePrefixTooLongError();
            return std::nullopt;
        }
        switch (c) {
        case '\n':
        case ' ':
        case '\t':
        case '\r':
        case '&':
        case '#':
        case '\'':
        case '\"':
        case '<':
        case '>':
        case '[':
        case ']':
        case '=':
        case '%':
        case '/':
        case ';':
        case '?':
        case '!':
        case '^':
        case '|':
        case ',':
        case '(':
        case ')':
        case '+':
        case '*':
            putChar(c);
            if (val && val->prefix == n + 1) {
                val->prefix = 0;
                putChar(':');
                --n;
            }
            return n;
        case ':':
            if (val) {
                if (val->prefix == 0) {
                    val->prefix = qint16(n + 2);
                } else { // only one colon allowed according to the namespace spec.
                    putChar(c);
                    return n;
                }
            } else {
                putChar(c);
                return n;
            }
            Q_FALLTHROUGH();
        default:
            textBuffer += QChar(ushort(c));
            ++n;
        }
    }

    if (val)
        val->prefix = 0;
    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    return 0;
}